

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
::find<std::vector<int,std::allocator<int>>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,absl::lts_20240722::hash_internal::Hash<std::vector<int,std::allocator<int>>>,std::equal_to<std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
           *this,key_arg<std::vector<int>_> *key)

{
  size_t hash;
  iterator iVar1;
  
  AssertHashEqConsistent<std::vector<int,std::allocator<int>>>(this,key);
  hash = hash_internal::MixingHashState::hash<std::vector<int,_std::allocator<int>_>,_0>(key);
  iVar1 = find_non_soo<std::vector<int,std::allocator<int>>>(this,key,hash);
  return iVar1;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }